

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::RandomOrderTexImage2DCase::createTexture(RandomOrderTexImage2DCase *this)

{
  ContextWrapper *this_00;
  uint uVar1;
  deUint32 type;
  uint uVar2;
  deUint32 dVar3;
  int i;
  size_type sVar4;
  uint uVar5;
  size_type __n;
  int iVar6;
  int height;
  deUint32 tex;
  int local_104;
  vector<int,_std::allocator<int>_> levels;
  TextureFormat fmt;
  Random rnd;
  PixelBufferAccess local_b0;
  TextureLevel levelData;
  Vec4 gMax;
  Vec4 gMin;
  Vector<float,_4> local_40;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    __n = 1;
  }
  else {
    uVar1 = (this->super_TextureSpecCase).m_width;
    uVar2 = 0x20;
    uVar5 = uVar2;
    if (uVar1 != 0) {
      uVar5 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x1f;
    }
    uVar1 = (this->super_TextureSpecCase).m_height;
    if (uVar1 != 0) {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    iVar6 = 0x1f - uVar2;
    if ((int)(0x1f - uVar2) < (int)(0x1f - uVar5)) {
      iVar6 = 0x1f - uVar5;
    }
    __n = (size_type)(iVar6 + 1);
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar3 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  std::vector<int,_std::allocator<int>_>::vector(&levels,__n,(allocator_type *)&local_b0);
  for (sVar4 = 0; __n != sVar4; sVar4 = sVar4 + 1) {
    levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [sVar4] = (int)sVar4;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  for (sVar4 = 0; __n != sVar4; sVar4 = sVar4 + 1) {
    local_104 = levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[sVar4];
    iVar6 = (this->super_TextureSpecCase).m_width >> ((byte)local_104 & 0x1f);
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    height = (this->super_TextureSpecCase).m_height >> ((byte)local_104 & 0x1f);
    if (height < 2) {
      height = 1;
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_b0,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gMax,1.0);
    randomVector<4>((Functional *)&gMin,&rnd,(Vector<float,_4> *)&local_b0,(Vector<float,_4> *)&gMax
                   );
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_b0,0.0);
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    randomVector<4>((Functional *)&gMax,&rnd,(Vector<float,_4> *)&local_b0,&local_40);
    tcu::TextureLevel::setSize(&levelData,iVar6,height,1);
    tcu::TextureLevel::getAccess(&local_b0,&levelData);
    tcu::fillWithComponentGradients(&local_b0,&gMin,&gMax);
    dVar3 = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_b0,&levelData);
    sglr::ContextWrapper::glTexImage2D
              (this_00,0xde1,local_104,dVar3,iVar6,height,0,dVar3,type,
               local_b0.super_ConstPixelBufferAccess.m_data);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&levels.super__Vector_base<int,_std::allocator<int>_>);
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		vector<int>			levels		(numLevels);

		for (int i = 0; i < numLevels; i++)
			levels[i] = i;
		rnd.shuffle(levels.begin(), levels.end());

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelNdx	= levels[ndx];
			int		levelW		= de::max(1, m_width	>> levelNdx);
			int		levelH		= de::max(1, m_height	>> levelNdx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, levelNdx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}